

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O1

golf_shader_uniform_t * golf_shader_fs_uniform_setup(golf_shader_t *shader,char *name,int n,...)

{
  vec4 *pvVar1;
  vec2 v;
  char *name_00;
  mat4 m;
  float fVar2;
  float fVar3;
  golf_shader_uniform_t *uniform;
  va_list args;
  undefined8 *local_130;
  
  uniform = golf_shader_get_fs_uniform(shader,name);
  if (uniform == (golf_shader_uniform_t *)0x0) {
    uniform = (golf_shader_uniform_t *)0x0;
  }
  else {
    local_130 = (undefined8 *)&stack0x00000008;
    if (0 < n) {
      do {
        if (*(uint *)(local_130 + 1) < 4) {
          name_00 = (char *)*local_130;
          pvVar1 = (vec4 *)((long)local_130 + 0xc);
          v.x = pvVar1->x;
          v.y = pvVar1->y;
          fVar2 = pvVar1->x;
          fVar3 = pvVar1->y;
          m.m[1] = fVar3;
          m.m[0] = fVar2;
          switch(*(uint *)(local_130 + 1)) {
          case 0:
            golf_shader_uniform_set_float(uniform,name_00,v.x);
            break;
          case 1:
            golf_shader_uniform_set_vec2(uniform,name_00,v);
            break;
          case 2:
            golf_shader_uniform_set_vec4(uniform,name_00,*pvVar1);
            break;
          case 3:
            m.m[3] = (float)(int)((ulong)*(undefined8 *)((long)local_130 + 0x14) >> 0x20);
            m.m[2] = (float)*(undefined4 *)((long)local_130 + 0x14);
            m.m._16_8_ = *(undefined8 *)((long)local_130 + 0x1c);
            m.m._24_8_ = *(undefined8 *)((long)local_130 + 0x24);
            m.m._32_8_ = *(undefined8 *)((long)local_130 + 0x2c);
            m.m._40_8_ = *(undefined8 *)((long)local_130 + 0x34);
            m.m._48_8_ = *(undefined8 *)((long)local_130 + 0x3c);
            m.m._56_8_ = *(undefined8 *)((long)local_130 + 0x44);
            golf_shader_uniform_set_mat4(uniform,name_00,m);
          }
        }
        n = n + -1;
        local_130 = local_130 + 10;
      } while (n != 0);
    }
  }
  return uniform;
}

Assistant:

golf_shader_uniform_t *golf_shader_fs_uniform_setup(golf_shader_t *shader, const char *name, int n, ...) {
    golf_shader_uniform_t *uniform = golf_shader_get_fs_uniform(shader, name);
    if (!uniform) {
        return NULL;
    }

    va_list args;
    va_start(args, n);
    for (int i = 0; i < n; i++) {
        golf_shader_uniform_value_t value = va_arg(args, golf_shader_uniform_value_t);
        switch (value.type) {
            case GOLF_SHADER_UNIFORM_VALUE_FLOAT:
                golf_shader_uniform_set_float(uniform, value.name, value.f);
                break;
            case GOLF_SHADER_UNIFORM_VALUE_VEC2:
                golf_shader_uniform_set_vec2(uniform, value.name, value.v2);
                break;
            case GOLF_SHADER_UNIFORM_VALUE_VEC4:
                golf_shader_uniform_set_vec4(uniform, value.name, value.v4);
                break;
            case GOLF_SHADER_UNIFORM_VALUE_MAT4:
                golf_shader_uniform_set_mat4(uniform, value.name, value.m4);
                break;
        }
    }
    va_end(args);

    return uniform;
}